

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GetDeallocator::operator()(GetDeallocator *this,Memory mem)

{
  if (this->dealloc_ == (_func_void_void_ptr_size_t *)0x0) {
    operator_delete(mem.ptr);
  }
  else {
    (*this->dealloc_)(mem.ptr,mem.size);
  }
  *this->space_allocated_ = *this->space_allocated_ + mem.size;
  return;
}

Assistant:

void operator()(SerialArena::Memory mem) const {
#ifdef ADDRESS_SANITIZER
    // This memory was provided by the underlying allocator as unpoisoned,
    // so return it in an unpoisoned state.
    ASAN_UNPOISON_MEMORY_REGION(mem.ptr, mem.size);
#endif  // ADDRESS_SANITIZER
    if (dealloc_) {
      dealloc_(mem.ptr, mem.size);
    } else {
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
      ::operator delete(mem.ptr, mem.size);
#else
      ::operator delete(mem.ptr);
#endif
    }
    *space_allocated_ += mem.size;
  }